

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calicam_mono.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  uint uVar2;
  long lVar3;
  ostream *poVar4;
  string *this;
  int iVar5;
  _InputArray local_4a0;
  _InputArray local_488;
  _InputArray local_468;
  string param_win_name;
  undefined8 local_428;
  _InputArray local_420;
  VideoCapture vcapture;
  Mat raw_imgl;
  string param_name;
  string local_358;
  string image_name;
  Mat rect_imgl;
  Mat raw_imgr;
  Mat raw_img;
  Mat rect_imgr;
  char win_name [256];
  Mat small_img;
  
  this = &param_name;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)this,"../astar_calicam_mono.yml",(allocator<char> *)win_name);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&image_name,"../times_square.jpg",(allocator<char> *)win_name);
  if (argc == 2) {
LAB_00105b0b:
    std::__cxx11::string::assign((char *)this);
  }
  else if (argc == 3) {
    std::__cxx11::string::assign((char *)&param_name);
    this = &image_name;
    goto LAB_00105b0b;
  }
  std::__cxx11::string::string((string *)&local_358,(string *)&param_name);
  LoadParameters(&local_358);
  std::__cxx11::string::~string((string *)&local_358);
  InitRectifyMap();
  cv::Mat::Mat(&raw_img);
  cv::VideoCapture::VideoCapture(&vcapture);
  if (live == true) {
    cv::VideoCapture::open((int)&vcapture,0);
    cVar1 = cv::VideoCapture::isOpened();
    if (cVar1 == '\0') {
      poVar4 = std::operator<<((ostream *)&std::cout,"Camera doesn\'t work");
      std::endl<char,std::char_traits<char>>(poVar4);
      goto LAB_001060c5;
    }
    cv::VideoCapture::set((int)&vcapture,(double)cap_cols);
    cv::VideoCapture::set((int)&vcapture,(double)cap_rows);
    cv::VideoCapture::set((int)&vcapture,30.0);
  }
  else {
    cv::imread((string *)win_name,(int)&image_name);
    cv::Mat::operator=(&raw_img,(Mat *)win_name);
    cv::Mat::~Mat((Mat *)win_name);
  }
  sprintf(win_name,"Raw Image: %d x %d",(ulong)(uint)cap_cols,(ulong)(uint)cap_rows);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&param_win_name,win_name,(allocator<char> *)&raw_imgl);
  cv::namedWindow((string *)&param_win_name,1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&raw_imgl,"V. FoV:  60    +",(allocator<char> *)&raw_imgr);
  cv::createTrackbar((string *)&raw_imgl,(string *)&param_win_name,(int *)0x0,vfov_max,OnTrackAngle,
                     (void *)0x0);
  std::__cxx11::string::~string((string *)&raw_imgl);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&raw_imgl,"V. FoV:  60    +",(allocator<char> *)&raw_imgr);
  cv::setTrackbarPos((string *)&raw_imgl,(string *)&param_win_name,vfov_bar);
  std::__cxx11::string::~string((string *)&raw_imgl);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&raw_imgl,"Size:  480 +",(allocator<char> *)&raw_imgr);
  cv::createTrackbar((string *)&raw_imgl,(string *)&param_win_name,(int *)0x0,size_max,OnTrackSize,
                     (void *)0x0);
  std::__cxx11::string::~string((string *)&raw_imgl);
  cv::Mat::Mat(&raw_imgl);
  cv::Mat::Mat(&raw_imgr);
  cv::Mat::Mat(&rect_imgl);
  cv::Mat::Mat(&rect_imgr);
  while( true ) {
    if (changed == true) {
      InitRectifyMap();
      changed = false;
    }
    if (live == true) {
      cv::VideoCapture::operator>>(&vcapture,&raw_img);
    }
    lVar3 = cv::Mat::total();
    if (lVar3 == 0) break;
    cv::Mat::operator=(&raw_imgl,&raw_img);
    local_488.sz.width = 0;
    local_488.sz.height = 0;
    local_488.flags = 0x1010000;
    local_4a0.sz.width = 0;
    local_4a0.sz.height = 0;
    local_4a0.flags = 0x2010000;
    local_468.sz.width = 0;
    local_468.sz.height = 0;
    local_4a0.obj = &rect_imgl;
    local_420.sz.width = 0;
    local_420.sz.height = 0;
    local_468.flags = 0x1010000;
    local_468.obj = fmap;
    local_420.flags = 0x1010000;
    local_420.obj = fmap + 0x60;
    local_488.obj = &raw_img;
    cv::Scalar_<double>::Scalar_((Scalar_<double> *)&small_img);
    cv::remap(&local_488,(_OutputArray *)&local_4a0,&local_468,&local_420,1,0,(Scalar_ *)&small_img)
    ;
    cv::Mat::Mat(&small_img);
    local_488.sz.width = 0;
    local_488.sz.height = 0;
    local_488.flags = 0x1010000;
    local_4a0.sz.width = 0;
    local_4a0.sz.height = 0;
    local_4a0.flags = 0x2010000;
    local_428 = 0;
    local_4a0.obj = &small_img;
    local_488.obj = &raw_imgl;
    cv::resize(0x3fe0000000000000,0x3fe0000000000000,&local_488,&local_4a0,&local_428,1);
    local_488.sz.width = 0;
    local_488.sz.height = 0;
    local_488.flags = 0x1010000;
    local_488.obj = &small_img;
    cv::imshow((string *)&param_win_name,&local_488);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_488,"Rectified Image",(allocator<char> *)&local_468);
    local_4a0.sz.width = 0;
    local_4a0.sz.height = 0;
    local_4a0.flags = 0x1010000;
    local_4a0.obj = &rect_imgl;
    cv::imshow((string *)&local_488,&local_4a0);
    std::__cxx11::string::~string((string *)&local_488);
    uVar2 = cv::waitKey(1);
    iVar5 = uVar2 << 0x18;
    if (iVar5 == 0x20000000) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_488,"img.jpg",(allocator<char> *)&local_420);
      local_4a0.sz.width = 0;
      local_4a0.sz.height = 0;
      local_4a0.flags = 0x1010000;
      local_4a0.obj = &rect_imgl;
      local_468.flags = 0;
      local_468._4_4_ = 0;
      local_468.obj = (undefined1 *)0x0;
      local_468.sz.width = 0;
      local_468.sz.height = 0;
      cv::imwrite((string *)&local_488,&local_4a0,(vector *)&local_468);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&local_468);
      std::__cxx11::string::~string((string *)&local_488);
    }
    else {
      if (iVar5 == 0x34000000) {
        mode = RECT_LONGLAT;
      }
      else if (iVar5 == 0x32000000) {
        mode = RECT_CYLINDRICAL;
      }
      else if (iVar5 == 0x33000000) {
        mode = RECT_FISHEYE;
      }
      else {
        if (iVar5 != 0x31000000) goto LAB_00105f96;
        mode = RECT_PERSPECTIVE;
      }
      changed = true;
    }
LAB_00105f96:
    cv::Mat::~Mat(&small_img);
    if (((uVar2 & 0xdf) == 0x51) || (iVar5 == 0x1b000000)) {
      cv::Mat::~Mat(&rect_imgr);
      cv::Mat::~Mat(&rect_imgl);
      cv::Mat::~Mat(&raw_imgr);
      cv::Mat::~Mat(&raw_imgl);
      std::__cxx11::string::~string((string *)&param_win_name);
      cv::VideoCapture::~VideoCapture(&vcapture);
      cv::Mat::~Mat(&raw_img);
      std::__cxx11::string::~string((string *)&image_name);
      std::__cxx11::string::~string((string *)&param_name);
      return 0;
    }
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"Image capture error");
  std::endl<char,std::char_traits<char>>(poVar4);
LAB_001060c5:
  exit(-1);
}

Assistant:

int main(int argc, char** argv) {
  std::string param_name = "../astar_calicam_mono.yml";
  std::string image_name = "../times_square.jpg";

  if (argc == 2) {
    param_name = argv[1];
  } else if (argc == 3) {
    param_name = argv[1];
    image_name = argv[2];
  }

  LoadParameters(param_name);
  InitRectifyMap();

  cv::Mat raw_img;
  cv::VideoCapture vcapture;
  if (live) {
    vcapture.open(0);

    if (!vcapture.isOpened()) {
      std::cout << "Camera doesn't work" << std::endl;
      exit(-1);
    }

    vcapture.set(cv::CAP_PROP_FRAME_WIDTH,  cap_cols);
    vcapture.set(cv::CAP_PROP_FRAME_HEIGHT, cap_rows);
    vcapture.set(cv::CAP_PROP_FPS, 30);
  } else {
    raw_img = cv::imread(image_name, cv::IMREAD_COLOR);
  }

  char win_name[256];
  sprintf(win_name, "Raw Image: %d x %d", cap_cols, cap_rows);
  std::string param_win_name(win_name);
  cv::namedWindow(param_win_name);

  cv::createTrackbar("V. FoV:  60    +", param_win_name, nullptr,   vfov_max,   OnTrackAngle);
  cv::setTrackbarPos("V. FoV:  60    +", param_win_name, vfov_bar);
  cv::createTrackbar("Size:  480 +", param_win_name, nullptr,  size_max,  OnTrackSize);

  cv::Mat raw_imgl, raw_imgr, rect_imgl, rect_imgr;
  while (1) {
    if (changed) {
      InitRectifyMap();
      changed = false;
    }

    if (live)
      vcapture >> raw_img;

    if (raw_img.total() == 0) {
      std::cout << "Image capture error" << std::endl;
      exit(-1);
    }

    raw_imgl = raw_img;
    cv::remap(raw_img, rect_imgl, fmap[0], fmap[1], 1, 0);

    cv::Mat small_img;
    cv::resize(raw_imgl, small_img, cv::Size(), 0.5, 0.5);
    imshow(param_win_name, small_img);
    imshow("Rectified Image", rect_imgl);

    char key = cv::waitKey(1);

    if (key == '1') {
      mode = RECT_PERSPECTIVE;
      changed = true;
    }

    if (key == '2') {
      mode = RECT_CYLINDRICAL;
      changed = true;
    }

    if (key == '3') {
      mode = RECT_FISHEYE;
      changed = true;
    }

    if (key == '4') {
      mode = RECT_LONGLAT;
      changed = true;
    }

    if (key == 32) {
      imwrite("img.jpg", rect_imgl);
    }

    if (key == 'q' || key == 'Q' || key == 27)
      break;
  }

  return 0;
}